

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O1

void Cudd_SetZddTree(DdManager *dd,MtrNode *tree)

{
  if (dd->treeZ != (MtrNode *)0x0) {
    Mtr_FreeTree(dd->treeZ);
  }
  dd->treeZ = tree;
  if (tree != (MtrNode *)0x0) {
    fixVarTree(tree,dd->permZ,dd->sizeZ);
    return;
  }
  return;
}

Assistant:

void
Cudd_SetZddTree(
  DdManager * dd,
  MtrNode * tree)
{
    if (dd->treeZ != NULL) {
        Mtr_FreeTree(dd->treeZ);
    }
    dd->treeZ = tree;
    if (tree == NULL) return;

    fixVarTree(tree, dd->permZ, dd->sizeZ);
    return;

}